

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

Triple * __thiscall
llvm::Triple::getBigEndianArchVariant(Triple *__return_storage_ptr__,Triple *this)

{
  ArchType AVar1;
  uint uVar2;
  
  Triple(__return_storage_ptr__,this);
  AVar1 = this->Arch;
  if (((ulong)AVar1 < 0x33) && ((0x7bfffb27ceacaU >> ((ulong)AVar1 & 0x3f) & 1) != 0)) {
    uVar2 = AVar1 - arm;
    if ((0x31 < uVar2) || ((0x3dfffd93e7565U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      llvm_unreachable_internal
                ("getBigEndianArchVariant: unknown triple.",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                 ,0x59b);
    }
    setArch(__return_storage_ptr__,*(ArchType *)(&DAT_001c4864 + (ulong)uVar2 * 4));
  }
  return __return_storage_ptr__;
}

Assistant:

Triple Triple::getBigEndianArchVariant() const {
  Triple T(*this);
  // Already big endian.
  if (!isLittleEndian())
    return T;
  switch (getArch()) {
  case Triple::UnknownArch:
  case Triple::amdgcn:
  case Triple::amdil64:
  case Triple::amdil:
  case Triple::avr:
  case Triple::hexagon:
  case Triple::hsail64:
  case Triple::hsail:
  case Triple::kalimba:
  case Triple::le32:
  case Triple::le64:
  case Triple::msp430:
  case Triple::nios2:
  case Triple::nvptx64:
  case Triple::nvptx:
  case Triple::r600:
  case Triple::riscv32:
  case Triple::riscv64:
  case Triple::shave:
  case Triple::spir64:
  case Triple::spir:
  case Triple::wasm32:
  case Triple::wasm64:
  case Triple::x86:
  case Triple::x86_64:
  case Triple::xcore:
  case Triple::renderscript32:
  case Triple::renderscript64:

  // ARM is intentionally unsupported here, changing the architecture would
  // drop any arch suffixes.
  case Triple::arm:
  case Triple::thumb:
    T.setArch(UnknownArch);
    break;

  case Triple::tcele:   T.setArch(Triple::tce);        break;
  case Triple::aarch64: T.setArch(Triple::aarch64_be); break;
  case Triple::bpfel:   T.setArch(Triple::bpfeb);      break;
  case Triple::mips64el:T.setArch(Triple::mips64);     break;
  case Triple::mipsel:  T.setArch(Triple::mips);       break;
  case Triple::ppc64le: T.setArch(Triple::ppc64);      break;
  case Triple::sparcel: T.setArch(Triple::sparc);      break;
  default:
    llvm_unreachable("getBigEndianArchVariant: unknown triple.");
  }
  return T;
}